

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InliningDecider.cpp
# Opt level: O0

FunctionInfo * __thiscall
InliningDecider::Inline
          (InliningDecider *this,FunctionBody *inliner,FunctionInfo *functionInfo,
          bool isConstructorCall,bool isPolymorphicCall,bool isCallback,uint16 constantArgInfo,
          ProfileId callSiteId,uint recursiveInlineDepth,bool allowRecursiveInlining)

{
  code *pcVar1;
  bool bVar2;
  ArgSlot AVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  LocalFunctionId LVar7;
  FunctionProxy *this_00;
  undefined4 extraout_var;
  ByteBlock *pBVar8;
  undefined4 extraout_var_00;
  char16 *pcVar9;
  undefined4 extraout_var_01;
  char16 *pcVar10;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  InliningDecider *pIVar11;
  undefined4 *puVar12;
  ValueType local_fc;
  OpCode local_fa;
  ValueType builtInReturnType;
  FunctionBody *pFStack_f8;
  OpCode builtInInlineCandidateOpCode;
  FunctionBody *inlinee;
  FunctionProxy *proxy;
  char16 debugStringBuffer2 [42];
  wchar local_88 [4];
  char16 debugStringBuffer [42];
  bool allowRecursiveInlining_local;
  bool isCallback_local;
  bool isPolymorphicCall_local;
  bool isConstructorCall_local;
  FunctionInfo *functionInfo_local;
  FunctionBody *inliner_local;
  InliningDecider *this_local;
  
  debugStringBuffer[0x26]._0_1_ = allowRecursiveInlining;
  debugStringBuffer[0x26]._1_1_ = isCallback;
  debugStringBuffer[0x27]._0_1_ = isPolymorphicCall;
  debugStringBuffer[0x27]._1_1_ = isConstructorCall;
  unique0x10000bcf = (InliningDecider *)functionInfo;
  this_00 = Js::FunctionInfo::GetFunctionProxy(functionInfo);
  if ((this_00 != (FunctionProxy *)0x0) &&
     (bVar2 = Js::FunctionProxy::IsFunctionBody(this_00), bVar2)) {
    if ((this->isLoopBody & 1U) != 0) {
      uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
      LVar7 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,InlineInJitLoopBodyPhase,uVar6,LVar7);
      if (bVar2) {
        if ((DAT_01ec73ca & 1) != 0) {
          uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
          LVar7 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
          bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,InlinePhase,uVar6,LVar7);
          if (bVar2) {
            iVar4 = (*(this->topFunc->super_ParseableFunctionInfo).super_FunctionProxy.
                      super_FinalizableObject.super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[7])();
            pcVar9 = Js::FunctionProxy::GetDebugNumberSet
                               ((FunctionProxy *)this->topFunc,(wchar (*) [42])local_88);
            Output::Print(L"INLINING: Skip Inline: Jit loop body: %s (%s)\n",
                          CONCAT44(extraout_var,iVar4),pcVar9);
            Output::Flush();
          }
        }
        return (FunctionInfo *)(InliningDecider *)0x0;
      }
    }
    pFStack_f8 = Js::FunctionProxy::GetFunctionBody(this_00);
    if (this->jitMode != FullJit) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InliningDecider.cpp"
                         ,0xfe,"(this->jitMode == ExecutionMode::FullJit)",
                         "this->jitMode == ExecutionMode::FullJit");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 0;
    }
    uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFStack_f8);
    LVar7 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFStack_f8);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,InlinePhase,uVar6,LVar7);
    if (!bVar2) {
      uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFStack_f8);
      LVar7 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFStack_f8);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,GlobOptPhase,uVar6,LVar7);
      if (((!bVar2) &&
          (bVar2 = ContinueInliningUserDefinedFunctions(this,this->bytecodeInlinedCount), bVar2)) &&
         ((this->isInDebugMode & 1U) == 0)) {
        bVar2 = Js::FunctionInfo::IsDeferred((FunctionInfo *)stack0xffffffffffffffd0);
        if ((bVar2) ||
           (pBVar8 = Js::FunctionBody::GetByteCode(pFStack_f8), pBVar8 == (ByteBlock *)0x0)) {
          uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
          LVar7 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
          bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,InlinePhase,uVar6,LVar7);
          if (bVar2) {
            iVar4 = (*(pFStack_f8->super_ParseableFunctionInfo).super_FunctionProxy.
                      super_FinalizableObject.super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[7])();
            pcVar9 = Js::FunctionProxy::GetDebugNumberSet
                               ((FunctionProxy *)pFStack_f8,(wchar (*) [42])local_88);
            iVar5 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.
                      super_FinalizableObject.super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[7])();
            pcVar10 = Js::FunctionProxy::GetDebugNumberSet
                                ((FunctionProxy *)inliner,(wchar (*) [42])&proxy);
            Output::Print(L"INLINING: Skip Inline: No bytecode\tInlinee: %s (%s)\tCaller: %s (%s)\n"
                          ,CONCAT44(extraout_var_00,iVar4),pcVar9,CONCAT44(extraout_var_01,iVar5),
                          pcVar10);
            Output::Flush();
          }
          return (FunctionInfo *)(InliningDecider *)0x0;
        }
        AVar3 = Js::ParseableFunctionInfo::GetInParamsCount
                          (&pFStack_f8->super_ParseableFunctionInfo);
        if (0xf < AVar3) {
          uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
          LVar7 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
          bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,InlinePhase,uVar6,LVar7);
          if (bVar2) {
            iVar4 = (*(pFStack_f8->super_ParseableFunctionInfo).super_FunctionProxy.
                      super_FinalizableObject.super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[7])();
            pcVar9 = Js::FunctionProxy::GetDebugNumberSet
                               ((FunctionProxy *)pFStack_f8,(wchar (*) [42])local_88);
            AVar3 = Js::ParseableFunctionInfo::GetInParamsCount
                              (&pFStack_f8->super_ParseableFunctionInfo);
            iVar5 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.
                      super_FinalizableObject.super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[7])();
            pcVar10 = Js::FunctionProxy::GetDebugNumberSet
                                ((FunctionProxy *)inliner,(wchar (*) [42])&proxy);
            Output::Print(L"INLINING: Skip Inline: Params count greater then MaxInlineeArgoutCount\tInlinee: %s (%s)\tParamcount: %d\tMaxInlineeArgoutCount: %d\tCaller: %s (%s)\n"
                          ,CONCAT44(extraout_var_02,iVar4),pcVar9,(ulong)AVar3,0xf,
                          CONCAT44(extraout_var_03,iVar5),pcVar10);
            Output::Flush();
          }
          return (FunctionInfo *)(InliningDecider *)0x0;
        }
        AVar3 = Js::ParseableFunctionInfo::GetInParamsCount
                          (&pFStack_f8->super_ParseableFunctionInfo);
        if ((AVar3 == 0) &&
           (bVar2 = Js::ParseableFunctionInfo::GetIsAsmjsMode
                              (&pFStack_f8->super_ParseableFunctionInfo), !bVar2)) {
          uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
          LVar7 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
          bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,InlinePhase,uVar6,LVar7);
          if (bVar2) {
            iVar4 = (*(pFStack_f8->super_ParseableFunctionInfo).super_FunctionProxy.
                      super_FinalizableObject.super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[7])();
            pcVar9 = Js::FunctionProxy::GetDebugNumberSet
                               ((FunctionProxy *)pFStack_f8,(wchar (*) [42])local_88);
            AVar3 = Js::ParseableFunctionInfo::GetInParamsCount
                              (&pFStack_f8->super_ParseableFunctionInfo);
            iVar5 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.
                      super_FinalizableObject.super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[7])();
            pcVar10 = Js::FunctionProxy::GetDebugNumberSet
                                ((FunctionProxy *)inliner,(wchar (*) [42])&proxy);
            Output::Print(L"INLINING: Skip Inline: Params count is zero!\tInlinee: %s (%s)\tParamcount: %d\tCaller: %s (%s)\n"
                          ,CONCAT44(extraout_var_04,iVar4),pcVar9,(ulong)AVar3,
                          CONCAT44(extraout_var_05,iVar5),pcVar10);
            Output::Flush();
          }
          return (FunctionInfo *)(InliningDecider *)0x0;
        }
        bVar2 = Js::ParseableFunctionInfo::GetDontInline(&pFStack_f8->super_ParseableFunctionInfo);
        if (bVar2) {
          uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
          LVar7 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
          bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,InlinePhase,uVar6,LVar7);
          if (bVar2) {
            iVar4 = (*(pFStack_f8->super_ParseableFunctionInfo).super_FunctionProxy.
                      super_FinalizableObject.super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[7])();
            pcVar9 = Js::FunctionProxy::GetDebugNumberSet
                               ((FunctionProxy *)pFStack_f8,(wchar (*) [42])local_88);
            iVar5 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.
                      super_FinalizableObject.super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[7])();
            pcVar10 = Js::FunctionProxy::GetDebugNumberSet
                                ((FunctionProxy *)inliner,(wchar (*) [42])&proxy);
            Output::Print(L"INLINING: Skip Inline: Do not inline\tInlinee: %s (%s)\tCaller: %s (%s)\n"
                          ,CONCAT44(extraout_var_06,iVar4),pcVar9,CONCAT44(extraout_var_07,iVar5),
                          pcVar10);
            Output::Flush();
          }
          return (FunctionInfo *)(InliningDecider *)0x0;
        }
        bVar2 = Js::FunctionProxy::IsClassConstructor((FunctionProxy *)pFStack_f8);
        if ((bVar2) && ((debugStringBuffer[0x27]._1_1_ & 1) == 0)) {
          uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
          LVar7 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
          bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,InlinePhase,uVar6,LVar7);
          if (bVar2) {
            iVar4 = (*(pFStack_f8->super_ParseableFunctionInfo).super_FunctionProxy.
                      super_FinalizableObject.super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[7])();
            pcVar9 = Js::FunctionProxy::GetDebugNumberSet
                               ((FunctionProxy *)pFStack_f8,(wchar (*) [42])local_88);
            iVar5 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.
                      super_FinalizableObject.super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[7])();
            pcVar10 = Js::FunctionProxy::GetDebugNumberSet
                                ((FunctionProxy *)inliner,(wchar (*) [42])&proxy);
            Output::Print(L"INLINING: Skip Inline: Class constructor without new keyword\tInlinee: %s (%s)\tCaller: %s (%s)\n"
                          ,CONCAT44(extraout_var_08,iVar4),pcVar9,CONCAT44(extraout_var_09,iVar5),
                          pcVar10);
            Output::Flush();
          }
          return (FunctionInfo *)(InliningDecider *)0x0;
        }
        bVar2 = DeciderInlineIntoInliner
                          (this,pFStack_f8,inliner,(bool)(debugStringBuffer[0x27]._1_1_ & 1),
                           (bool)((byte)debugStringBuffer[0x27] & 1),constantArgInfo,
                           recursiveInlineDepth,(bool)((byte)debugStringBuffer[0x26] & 1));
        if (!bVar2) {
          return (FunctionInfo *)(InliningDecider *)0x0;
        }
        iVar4 = (*(pFStack_f8->super_ParseableFunctionInfo).super_FunctionProxy.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [7])();
        pcVar9 = Js::FunctionProxy::GetDebugNumberSet
                           ((FunctionProxy *)pFStack_f8,(wchar (*) [42])local_88);
        uVar6 = Js::FunctionBody::GetByteCodeCount(pFStack_f8);
        TraceInlining(inliner,(char16 *)CONCAT44(extraout_var_10,iVar4),pcVar9,uVar6,this->topFunc,
                      this->bytecodeInlinedCount,pFStack_f8,(uint)callSiteId,
                      (bool)(this->isLoopBody & 1),(bool)(debugStringBuffer[0x26]._1_1_ & 1),
                      0xffffffff);
        uVar6 = Js::FunctionBody::GetByteCodeCount(pFStack_f8);
        this->bytecodeInlinedCount = uVar6 + this->bytecodeInlinedCount;
        pIVar11 = (InliningDecider *)Js::FunctionProxy::GetFunctionInfo((FunctionProxy *)pFStack_f8)
        ;
        return (FunctionInfo *)pIVar11;
      }
    }
    return (FunctionInfo *)(InliningDecider *)0x0;
  }
  ValueType::ValueType(&local_fc);
  GetBuiltInInfo((FunctionInfo *)stack0xffffffffffffffd0,&local_fa,&local_fc);
  bVar2 = Js::operator==(&local_fa,0);
  if ((bVar2) && (bVar2 = ValueType::IsUninitialized(&local_fc), bVar2)) {
    return (FunctionInfo *)(InliningDecider *)0x0;
  }
  if (this->jitMode != FullJit) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InliningDecider.cpp"
                       ,0x155,"(this->jitMode == ExecutionMode::FullJit)",
                       "this->jitMode == ExecutionMode::FullJit");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 0;
  }
  bVar2 = Js::operator!=(&local_fa,0);
  if (bVar2) {
    uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inliner);
    LVar7 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)inliner);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,InlinePhase,uVar6,LVar7);
    if (!bVar2) {
      uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inliner);
      LVar7 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)inliner);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,GlobOptPhase,uVar6,LVar7);
      if ((!bVar2) && ((debugStringBuffer[0x27]._1_1_ & 1) == 0)) goto LAB_0072e00e;
    }
    this_local = (InliningDecider *)0x0;
  }
  else {
LAB_0072e00e:
    this_local = stack0xffffffffffffffd0;
  }
  return (FunctionInfo *)this_local;
}

Assistant:

Js::FunctionInfo *InliningDecider::Inline(Js::FunctionBody *const inliner, 
    Js::FunctionInfo* functionInfo,
    bool isConstructorCall, 
    bool isPolymorphicCall, 
    bool isCallback, 
    uint16 constantArgInfo, 
    Js::ProfileId callSiteId, 
    uint recursiveInlineDepth, 
    bool allowRecursiveInlining)
{
#if defined(DBG_DUMP) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
    Js::FunctionProxy * proxy = functionInfo->GetFunctionProxy();
    if (proxy && proxy->IsFunctionBody())
    {
        if (isLoopBody && PHASE_OFF(Js::InlineInJitLoopBodyPhase, this->topFunc))
        {
            INLINE_TESTTRACE_VERBOSE(_u("INLINING: Skip Inline: Jit loop body: %s (%s)\n"), this->topFunc->GetDisplayName(),
                this->topFunc->GetDebugNumberSet(debugStringBuffer));
            return nullptr;
        }

        // Note: disable inline for debugger, as we can't bailout at return from function.
        // Alternative can be generate this bailout as part of inline, which can be done later as perf improvement.
        const auto inlinee = proxy->GetFunctionBody();
        Assert(this->jitMode == ExecutionMode::FullJit);
        if (PHASE_OFF(Js::InlinePhase, inlinee) ||
            PHASE_OFF(Js::GlobOptPhase, inlinee) ||
            !ContinueInliningUserDefinedFunctions(this->bytecodeInlinedCount) ||
            this->isInDebugMode)
        {
            return nullptr;
        }

        if (functionInfo->IsDeferred() || inlinee->GetByteCode() == nullptr)
        {
            // DeferredParse...
            INLINE_TESTTRACE(_u("INLINING: Skip Inline: No bytecode\tInlinee: %s (%s)\tCaller: %s (%s)\n"),
                inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer), inliner->GetDisplayName(),
                inliner->GetDebugNumberSet(debugStringBuffer2));
            return nullptr;
        }

#ifdef _M_IX86
        if (inlinee->GetHasTry())
        {
            INLINE_TESTTRACE(_u("INLINING: Skip Inline: Has try\tInlinee: %s (%s)\tCaller: %s (%s)\n"),
            inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer), inliner->GetDisplayName(),
            inliner->GetDebugNumberSet(debugStringBuffer2));
            return nullptr;
        }
#endif

        // This is a hard limit as the argOuts array is statically sized.
        if (inlinee->GetInParamsCount() > Js::InlineeCallInfo::MaxInlineeArgoutCount)
        {
            INLINE_TESTTRACE(_u("INLINING: Skip Inline: Params count greater then MaxInlineeArgoutCount\tInlinee: %s (%s)\tParamcount: %d\tMaxInlineeArgoutCount: %d\tCaller: %s (%s)\n"),
                inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer), inlinee->GetInParamsCount(), Js::InlineeCallInfo::MaxInlineeArgoutCount,
                inliner->GetDisplayName(), inliner->GetDebugNumberSet(debugStringBuffer2));
            return nullptr;
        }

        // Wasm functions can have no params
        if (inlinee->GetInParamsCount() == 0 && !inlinee->GetIsAsmjsMode())
        {
            // Inline candidate has no params, not even a this pointer.  This can only be the global function,
            // which we shouldn't inline.
            INLINE_TESTTRACE(_u("INLINING: Skip Inline: Params count is zero!\tInlinee: %s (%s)\tParamcount: %d\tCaller: %s (%s)\n"),
                inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer), inlinee->GetInParamsCount(),
                inliner->GetDisplayName(), inliner->GetDebugNumberSet(debugStringBuffer2));
            return nullptr;
        }

        if (inlinee->GetDontInline())
        {
            INLINE_TESTTRACE(_u("INLINING: Skip Inline: Do not inline\tInlinee: %s (%s)\tCaller: %s (%s)\n"),
                inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer), inliner->GetDisplayName(),
                inliner->GetDebugNumberSet(debugStringBuffer2));
            return nullptr;
        }

        // Do not inline a call to a class constructor if it isn't part of a new expression since the call will throw a TypeError anyway.
        if (inlinee->IsClassConstructor() && !isConstructorCall)
        {
            INLINE_TESTTRACE(_u("INLINING: Skip Inline: Class constructor without new keyword\tInlinee: %s (%s)\tCaller: %s (%s)\n"),
                inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer), inliner->GetDisplayName(),
                inliner->GetDebugNumberSet(debugStringBuffer2));
            return nullptr;
        }

        if (!DeciderInlineIntoInliner(inlinee, inliner, isConstructorCall, isPolymorphicCall, constantArgInfo, recursiveInlineDepth, allowRecursiveInlining))
        {
            return nullptr;
        }

#if defined(ENABLE_DEBUG_CONFIG_OPTIONS)
        TraceInlining(inliner, inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer), inlinee->GetByteCodeCount(), this->topFunc, this->bytecodeInlinedCount, inlinee, callSiteId, this->isLoopBody, isCallback);
#endif

        this->bytecodeInlinedCount += inlinee->GetByteCodeCount();
        return inlinee->GetFunctionInfo();
    }

    Js::OpCode builtInInlineCandidateOpCode;
    ValueType builtInReturnType;
    GetBuiltInInfo(functionInfo, &builtInInlineCandidateOpCode, &builtInReturnType);

    if(builtInInlineCandidateOpCode == 0 && builtInReturnType.IsUninitialized())
    {
        return nullptr;
    }

    Assert(this->jitMode == ExecutionMode::FullJit);
    if (builtInInlineCandidateOpCode != 0 &&
        (
            PHASE_OFF(Js::InlinePhase, inliner) ||
            PHASE_OFF(Js::GlobOptPhase, inliner) ||
            isConstructorCall
        ))
    {
        return nullptr;
    }

    // Note: for built-ins at this time we don't have enough data (the instr) to decide whether it's going to be inlined.
    return functionInfo;
}